

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O3

float __thiscall
embree::ParallelIntersectBenchmark::benchmark
          (ParallelIntersectBenchmark *this,VerifyApplication *state)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  char cVar4;
  runtime_error *this_00;
  task_group_context context;
  auto_partitioner local_b9;
  double local_b8;
  anon_class_8_1_8991fb9c local_b0;
  anon_class_8_1_898bcfc2_conflict7 local_a8;
  task_group_context local_a0;
  
  local_b8 = getSeconds();
  uVar1 = this->N;
  uVar2 = this->dN;
  local_a0.my_version = proxy_support;
  local_a0.my_traits = (context_traits)0x4;
  local_a0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_a0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_a0.my_name = CUSTOM_CTX;
  local_b0.this = this;
  tbb::detail::r1::initialize(&local_a0);
  local_a8.func = &local_b0;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for<unsigned_long,embree::ParallelIntersectBenchmark::benchmark(embree::VerifyApplication*)::_lambda(unsigned_long)_1_>(unsigned_long,embree::ParallelIntersectBenchmark::benchmark(embree::VerifyApplication*)::_lambda(unsigned_long)_1_const&)::_lambda(unsigned_long)_1_,tbb::detail::d1::auto_partitioner_const>
            (0,(ulong)uVar1 / (ulong)uVar2,1,&local_a8,&local_b9,&local_a0);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_a0);
  if (cVar4 == '\0') {
    tbb::detail::r1::destroy(&local_a0);
    dVar3 = getSeconds();
    return ((float)this->N * 1e-06) / (float)(dVar3 - local_b8);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float benchmark(VerifyApplication* state)
    {
      double t0 = getSeconds();
      parallel_for((size_t)N/dN, [&](size_t i) {
          render_block(i*dN, dN);
      });
      double t1 = getSeconds();
      return 1E-6f * (float)(N)/float(t1-t0);
    }